

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O1

void __thiscall
TPZFront<float>::STensorProductMTData::~STensorProductMTData(STensorProductMTData *this)

{
  void *pvVar1;
  pair<int,_TPZFront<float>::STensorProductMTData_*> **pppVar2;
  TPZSemaphore *pTVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  this->fRunning = false;
  uVar6 = (uint)(this->fWorkSem).fNElements;
  if (0 < (int)uVar6) {
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    lVar4 = 0;
    do {
      TPZSemaphore::Post((TPZSemaphore *)((long)&((this->fWorkSem).fStore)->fCounter + lVar4));
      lVar4 = lVar4 + 0x60;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  if (0 < (int)uVar6) {
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    lVar4 = 0;
    do {
      std::thread::join();
      pvVar1 = *(void **)((long)(this->fThreadData).fStore + lVar4);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,0x10);
      }
      *(undefined8 *)((long)(this->fThreadData).fStore + lVar4) = 0;
      lVar4 = lVar4 + 8;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  (this->fThreadData)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019a7550;
  pppVar2 = (this->fThreadData).fStore;
  if (pppVar2 != (pair<int,_TPZFront<float>::STensorProductMTData_*> **)0x0) {
    operator_delete__(pppVar2);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->fThreads);
  (this->fWorkSem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019a7500;
  pTVar3 = (this->fWorkSem).fStore;
  if (pTVar3 != (TPZSemaphore *)0x0) {
    lVar4 = *(long *)&pTVar3[-1].field_0x58;
    if (lVar4 != 0) {
      lVar5 = lVar4 * 0x60;
      do {
        std::condition_variable::~condition_variable
                  ((condition_variable *)((long)pTVar3 + lVar5 + -0x30));
        lVar5 = lVar5 + -0x60;
      } while (lVar5 != 0);
    }
    operator_delete__(&pTVar3[-1].field_0x58,lVar4 * 0x60 + 8);
  }
  std::condition_variable::~condition_variable(&(this->fWorkDoneSem).fCond);
  return;
}

Assistant:

~STensorProductMTData(){
			
			this->fRunning = false;
			const int nthreads = fWorkSem.NElements();
			for(int i = 0; i < nthreads; i++){
        fWorkSem[i].Post();
			}
			for(int i = 0; i < nthreads; i++){
        fThreads[i].join();
				delete fThreadData[i];
				fThreadData[i] = NULL;
			}
			
		}